

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

bool __thiscall fasttext::Dictionary::discard(Dictionary *this,int32_t id,real rand)

{
  element_type *peVar1;
  const_reference pvVar2;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  bool local_1;
  
  if (in_ESI < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/dictionary.cc"
                  ,0x83,"bool fasttext::Dictionary::discard(int32_t, real) const");
  }
  if (in_ESI < *(int *)(in_RDI + 0x5c)) {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x162f7e);
    if (peVar1->model == sup) {
      local_1 = false;
    }
    else {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x40),(long)in_ESI);
      local_1 = *pvVar2 < in_XMM0_Da;
    }
    return local_1;
  }
  __assert_fail("id < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/dictionary.cc"
                ,0x84,"bool fasttext::Dictionary::discard(int32_t, real) const");
}

Assistant:

bool Dictionary::discard(int32_t id, real rand) const {
	assert(id >= 0);
	assert(id < nwords_);
	if (args_->model == model_name::sup) {
		return false;
	}
	return rand > pdiscard_[id];
}